

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void produce_gradients_for_sb(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  _Bool _Var1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  BLOCK_SIZE unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int num_planes;
  SPEED_FEATURES *sf;
  undefined4 in_stack_00000018;
  PLANE_TYPE in_stack_ffffffffffffffce;
  BLOCK_SIZE in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  *(undefined1 *)(in_RSI + 0x1f6c0) = 0;
  *(undefined1 *)(in_RSI + 0x1f6c1) = 0;
  _Var1 = is_gradient_caching_for_hog_enabled
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (_Var1) {
    iVar2 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    av1_setup_src_planes
              ((MACROBLOCK *)CONCAT44(mi_col,in_stack_00000018),(YV12_BUFFER_CONFIG *)sf,num_planes,
               in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    if (*(int *)(in_RDI + 0x60b88) != 0) {
      compute_gradient_info_sb
                ((MACROBLOCK *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf,
                 in_stack_ffffffffffffffce);
      *(undefined1 *)(in_RSI + 0x1f6c0) = 1;
    }
    if ((*(int *)(in_RDI + 0x60b8c) != 0) && (1 < iVar2)) {
      compute_gradient_info_sb
                ((MACROBLOCK *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf,
                 in_stack_ffffffffffffffce);
      *(undefined1 *)(in_RSI + 0x1f6c1) = 1;
    }
  }
  return;
}

Assistant:

static inline void produce_gradients_for_sb(AV1_COMP *cpi, MACROBLOCK *x,
                                            BLOCK_SIZE sb_size, int mi_row,
                                            int mi_col) {
  // Initialise flags related to hog data caching.
  x->is_sb_gradient_cached[PLANE_TYPE_Y] = false;
  x->is_sb_gradient_cached[PLANE_TYPE_UV] = false;
  if (!is_gradient_caching_for_hog_enabled(cpi)) return;

  const SPEED_FEATURES *sf = &cpi->sf;
  const int num_planes = av1_num_planes(&cpi->common);

  av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, sb_size);

  if (sf->intra_sf.intra_pruning_with_hog) {
    compute_gradient_info_sb(x, sb_size, PLANE_TYPE_Y);
    x->is_sb_gradient_cached[PLANE_TYPE_Y] = true;
  }
  if (sf->intra_sf.chroma_intra_pruning_with_hog && num_planes > 1) {
    compute_gradient_info_sb(x, sb_size, PLANE_TYPE_UV);
    x->is_sb_gradient_cached[PLANE_TYPE_UV] = true;
  }
}